

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlist.c
# Opt level: O3

int dlist_insl_end(dlist_head_t *head,dlist_t *dlist)

{
  dlist_s *pdVar1;
  dlist_s *pdVar2;
  int iVar3;
  
  iVar3 = 0;
  if (dlist != (dlist_t *)0x0 && head != (dlist_head_t *)0x0) {
    if ((head->dlist == (dlist_s *)0x0) || (pdVar1 = head->end, pdVar1 == (dlist_s *)0x0)) {
      head->dlist = dlist;
      head->end = dlist;
      head->num = 1;
    }
    else {
      pdVar2 = pdVar1->next;
      dlist->next = pdVar2;
      if (pdVar2 != (dlist_s *)0x0) {
        pdVar2->prev = dlist;
      }
      pdVar1->next = dlist;
      dlist->prev = pdVar1;
      head->end = dlist;
      head->num = head->num + 1;
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int dlist_insl_end(dlist_head_t *head,
      dlist_t *dlist) {
   if (!head || !dlist)
      return 0;

   if (!head->dlist || !head->end) {
      head->dlist = dlist;
      head->end  = dlist;
      head->num  = 1;
      return 1;
   } else {
      return dlist_insl_after(head, head->end, dlist);
   }
}